

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_ns_local_search.h
# Opt level: O3

void __thiscall
fm_ns_local_search::move_node
          (fm_ns_local_search *this,AdjList *G,NodeID *node,PartitionID *to_block,
          PartitionID *other_block,vector<int,_std::allocator<int>_> *block_weights,
          vector<bool,_std::allocator<bool>_> *moved_out_of_S,
          vector<maxNodeHeap,_std::allocator<maxNodeHeap>_> *queues,
          vector<change_set,_std::allocator<change_set>_> *rollback_info)

{
  pointer *ppcVar1;
  ulong *puVar2;
  iterator iVar3;
  pointer piVar4;
  pointer pvVar5;
  uint *puVar6;
  int *piVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  pointer pmVar9;
  change_set cVar10;
  change_set cVar11;
  iterator iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int *piVar16;
  uint uVar17;
  ulong uVar18;
  int *piVar19;
  undefined1 *puVar20;
  uint *puVar21;
  uint *puVar22;
  vector<int,_std::allocator<int>_> to_be_updated;
  vector<int,_std::allocator<int>_> to_be_added;
  change_set cur_move;
  uint local_ac;
  uint local_a8;
  PartitionID PStack_a4;
  int local_9c;
  uint *local_98;
  iterator iStack_90;
  int *local_88;
  vector<int,_std::allocator<int>_> *local_78;
  AdjList *local_70;
  uint *local_68;
  iterator iStack_60;
  int *local_58;
  change_set local_48;
  int *local_40;
  ulong local_38;
  
  local_48.node = *node;
  local_48.block =
       (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start[local_48.node];
  iVar3._M_current =
       (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_78 = block_weights;
  local_70 = G;
  if (iVar3._M_current ==
      (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<change_set,std::allocator<change_set>>::_M_realloc_insert<change_set_const&>
              ((vector<change_set,std::allocator<change_set>> *)rollback_info,iVar3,&local_48);
  }
  else {
    cVar11.block = local_48.block;
    cVar11.node = local_48.node;
    *iVar3._M_current = cVar11;
    ppcVar1 = &(rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  iVar14 = *to_block;
  (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start[*node] = iVar14;
  piVar4 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar16 = piVar4 + iVar14;
  *piVar16 = *piVar16 + 1;
  piVar16 = piVar4 + 2;
  *piVar16 = *piVar16 + -1;
  iVar14 = *node;
  uVar18 = (ulong)iVar14;
  iVar13 = iVar14 + 0x3f;
  if (-1 < (long)uVar18) {
    iVar13 = iVar14;
  }
  puVar2 = (moved_out_of_S->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           (long)(iVar13 >> 6) +
           (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar2 = *puVar2 | 1L << ((byte)iVar14 & 0x3f);
  local_58 = (int *)0x0;
  local_68 = (uint *)0x0;
  iStack_60._M_current = (int *)0x0;
  local_88 = (int *)0x0;
  local_98 = (uint *)0x0;
  iStack_90._M_current = (int *)0x0;
  pvVar5 = (local_70->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar21 = *(uint **)&pvVar5[uVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data;
  puVar6 = (uint *)pvVar5[uVar18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  if (puVar21 != puVar6) {
    local_38 = 0x800000000000003f;
    local_40 = other_block;
    do {
      local_ac = *puVar21;
      lVar15 = (long)(int)local_ac;
      if ((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar15] < 0) {
        piVar4 = (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar14 = piVar4[lVar15];
        if (iVar14 == *other_block) {
          PStack_a4 = piVar4[lVar15];
          iVar3._M_current =
               (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_a8 = local_ac;
          if (iVar3._M_current ==
              (rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<change_set,std::allocator<change_set>>::_M_realloc_insert<change_set_const&>
                      ((vector<change_set,std::allocator<change_set>> *)rollback_info,iVar3,
                       (change_set *)&local_a8);
            lVar15 = (long)(int)local_ac;
          }
          else {
            cVar10.block = PStack_a4;
            cVar10.node = local_ac;
            *iVar3._M_current = cVar10;
            ppcVar1 = &(rollback_info->super__Vector_base<change_set,_std::allocator<change_set>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          (this->partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar15] = 2;
          piVar4 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar16 = piVar4 + *other_block;
          *piVar16 = *piVar16 + -1;
          piVar16 = piVar4 + 2;
          *piVar16 = *piVar16 + 1;
          uVar18 = (ulong)(int)local_ac;
          uVar17 = local_ac + 0x3f;
          if (-1 < (long)uVar18) {
            uVar17 = local_ac;
          }
          if (((moved_out_of_S->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [(long)((int)uVar17 >> 6) +
                (ulong)((uVar18 & local_38) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar18 & 0x3f) & 1) == 0) {
            if (iStack_60._M_current == local_58) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_68,iStack_60,(int *)&local_ac);
            }
            else {
              *iStack_60._M_current = local_ac;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
          }
          pvVar5 = (local_70->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar7 = pvVar5[(int)local_ac].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar16 = pvVar5[(int)local_ac].super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start; other_block = local_40,
              piVar16 != piVar7; piVar16 = piVar16 + 1) {
            local_9c = *piVar16;
            if (((this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[local_9c] < 0) &&
               (iVar14 = (*(((queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_priority_queue_interface)._vptr_priority_queue_interface[0xd])(),
               (char)iVar14 != '\0')) {
              if (iStack_90._M_current == local_88) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_98,iStack_90,&local_9c);
              }
              else {
                *iStack_90._M_current = local_9c;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
            }
          }
        }
        else if (iVar14 == 2) {
          if (iStack_90._M_current == local_88) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_98,iStack_90,(int *)&local_ac);
          }
          else {
            *iStack_90._M_current = local_ac;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
      }
      iVar12._M_current = iStack_60._M_current;
      puVar21 = puVar21 + 1;
      puVar22 = local_68;
    } while (puVar21 != puVar6);
    for (; puVar22 != (uint *)iVar12._M_current; puVar22 = puVar22 + 1) {
      uVar17 = *puVar22;
      uVar18 = 1;
      local_a8 = 1;
      local_ac = 1;
      pvVar5 = (local_70->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar16 = pvVar5[(int)uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar7 = pvVar5[(int)uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar16 != piVar7) {
        pvVar8 = this->partition_index;
        piVar4 = (this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if (piVar4[*piVar16] < 0) {
            iVar14 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[*piVar16];
            piVar19 = (int *)&local_ac;
            if (iVar14 != 0) {
              if (iVar14 != 1) goto LAB_00121b86;
              piVar19 = (int *)&local_a8;
            }
            *piVar19 = *piVar19 + -1;
          }
LAB_00121b86:
          piVar16 = piVar16 + 1;
        } while (piVar16 != piVar7);
        uVar18 = (ulong)local_a8;
      }
      pmVar9 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (*(pmVar9->super_priority_queue_interface)._vptr_priority_queue_interface[4])
                (pmVar9,(ulong)uVar17,uVar18);
      pmVar9 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (*pmVar9[1].super_priority_queue_interface._vptr_priority_queue_interface[4])
                (pmVar9 + 1,(ulong)uVar17,(ulong)local_ac);
    }
  }
  local_78 = (vector<int,_std::allocator<int>_> *)iStack_90._M_current;
  if (local_98 != (uint *)iStack_90._M_current) {
    puVar21 = local_98;
    do {
      uVar17 = *puVar21;
      uVar18 = 1;
      local_a8 = 1;
      local_ac = 1;
      pvVar5 = (local_70->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar16 = pvVar5[(int)uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar7 = pvVar5[(int)uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar16 != piVar7) {
        pvVar8 = this->partition_index;
        piVar4 = (this->x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if ((piVar4[*piVar16] < 0) &&
             ((iVar14 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[*piVar16],
              puVar20 = (undefined1 *)&local_ac, iVar14 == 0 ||
              (puVar20 = (undefined1 *)&local_a8, iVar14 == 1)))) {
            *(int *)puVar20 = *(int *)puVar20 + -1;
          }
          piVar16 = piVar16 + 1;
        } while (piVar16 != piVar7);
        uVar18 = (ulong)local_a8;
      }
      pmVar9 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (*(pmVar9->super_priority_queue_interface)._vptr_priority_queue_interface[10])
                (pmVar9,(ulong)uVar17,uVar18);
      pmVar9 = (queues->super__Vector_base<maxNodeHeap,_std::allocator<maxNodeHeap>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (*pmVar9[1].super_priority_queue_interface._vptr_priority_queue_interface[10])
                (pmVar9 + 1,(ulong)uVar17,(ulong)local_ac);
      puVar21 = puVar21 + 1;
    } while ((vector<int,_std::allocator<int>_> *)puVar21 != local_78);
  }
  if (local_98 != (uint *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_68 != (uint *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return;
}

Assistant:

inline
void fm_ns_local_search::move_node( AdjList & G, NodeID & node, PartitionID & to_block, PartitionID & other_block, 
                                    std::vector< NodeWeight > & block_weights,
                                    std::vector< bool > & moved_out_of_S, 
                                    std::vector< maxNodeHeap > & queues,
                                    std::vector< change_set > & rollback_info) {

        change_set cur_move;
        cur_move.node = node;
        cur_move.block = partition_index[node];
        rollback_info.push_back(cur_move);

        partition_index[node] = to_block;
        block_weights[to_block] += 1;
        block_weights[2] -= 1;
        moved_out_of_S[node] = true;

        std::vector<NodeID> to_be_added;
        std::vector<NodeID> to_be_updated; // replace by hashmap?
        Gain gain_achieved = 1;

        for (int neighbor : G[node])
        {
                if (x[neighbor] < 0) {
                        if (partition_index[neighbor] == other_block) {
                                change_set cur_move;
                                cur_move.node = neighbor;
                                cur_move.block = partition_index[neighbor];
                                rollback_info.push_back(cur_move);

                                partition_index[neighbor] = 2;
                                block_weights[other_block] -= 1;
                                block_weights[2]           += 1;
                                gain_achieved              -= 1;

                                if(!moved_out_of_S[neighbor]) {
                                        to_be_added.push_back(neighbor);
                                }

                                for (int v : G[neighbor]) {
                                        if(x[v] < 0) {
                                                if (queues[0].contains(v)) {
                                                        to_be_updated.push_back(v);
                                                }
                                        }
                                }

                        } else if(partition_index[neighbor] == 2) {
                                to_be_updated.push_back(neighbor);
                        }
                }
        }

        Gain toLHS = 0;
        Gain toRHS = 0;

        for(NodeID node : to_be_added) {
                compute_gain(G, node, toLHS, toRHS);
                queues[0].insert(node, toLHS);
                queues[1].insert(node, toRHS);
        }

        for(NodeID node : to_be_updated) {
                compute_gain(G, node, toLHS, toRHS);
                queues[0].changeKey(node, toLHS);
                queues[1].changeKey(node, toRHS);
        }
}